

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

void printhead(fout f,rnndb *db)

{
  int iVar1;
  char **ppcVar2;
  uint uVar3;
  size_t sVar4;
  rnnauthor *prVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  stat sb;
  tm local_f8;
  stat local_c0;
  
  stat(f.name,&local_c0);
  gmtime_r(&local_c0.st_mtim.tv_sec,&local_f8);
  uVar9 = 0;
  fprintf((FILE *)f.file,"#ifndef %s\n",f.guard);
  fprintf((FILE *)f.file,"#define %s\n",f.guard);
  fputc(10,(FILE *)f.file);
  fwrite("/* Autogenerated file, DO NOT EDIT manually!\n\nThis file was generated by the rules-ng-ng headergen tool in this git repository:\nhttp://0x04.net/cgit/index.cgi/rules-ng-ng\ngit clone git://0x04.net/rules-ng-ng\n\nThe rules-ng-ng source files this header was generated from are:\n"
         ,0x112,1,(FILE *)f.file);
  iVar1 = db->filesnum;
  if (0 < (long)iVar1) {
    ppcVar2 = db->files;
    lVar7 = 0;
    do {
      sVar4 = strlen(ppcVar2[lVar7]);
      uVar3 = (uint)sVar4;
      if ((uint)sVar4 < uVar9) {
        uVar3 = uVar9;
      }
      uVar9 = uVar3;
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
    if (0 < iVar1) {
      lVar7 = 0;
      do {
        pcVar6 = db->files[lVar7];
        sVar4 = strlen(pcVar6);
        fprintf((FILE *)f.file,"- %s%*s ",pcVar6,(ulong)(uVar9 - (int)sVar4),"");
        print_file_info(f.file,db->files[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < db->filesnum);
    }
  }
  fwrite("\nCopyright (C) ",0xf,1,(FILE *)f.file);
  uVar9 = (db->copyright).firstyear;
  if ((uVar9 != 0) && (uVar9 < local_f8.tm_year + 0x76cU)) {
    fprintf((FILE *)f.file,"%u-");
  }
  fprintf((FILE *)f.file,"%u",(ulong)(local_f8.tm_year + 0x76c));
  if ((db->copyright).authorsnum != 0) {
    fwrite(" by the following authors:",0x1a,1,(FILE *)f.file);
    if (0 < (db->copyright).authorsnum) {
      lVar7 = 0;
      do {
        fwrite("\n- ",3,1,(FILE *)f.file);
        prVar5 = (db->copyright).authors[lVar7];
        if (prVar5->name != (char *)0x0) {
          fputs(prVar5->name,(FILE *)f.file);
          prVar5 = (db->copyright).authors[lVar7];
        }
        if (prVar5->email != (char *)0x0) {
          fprintf((FILE *)f.file," <%s>");
          prVar5 = (db->copyright).authors[lVar7];
        }
        if (prVar5->nicknamesnum != 0) {
          if (0 < prVar5->nicknamesnum) {
            lVar8 = 0;
            do {
              pcVar6 = ", ";
              if (lVar8 == 0) {
                pcVar6 = " (";
              }
              fprintf((FILE *)f.file,"%s%s",pcVar6,prVar5->nicknames[lVar8]);
              lVar8 = lVar8 + 1;
              prVar5 = (db->copyright).authors[lVar7];
            } while (lVar8 < prVar5->nicknamesnum);
          }
          fputc(0x29,(FILE *)f.file);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (db->copyright).authorsnum);
    }
  }
  fputc(10,(FILE *)f.file);
  if ((db->copyright).license != (char *)0x0) {
    fprintf((FILE *)f.file,"\n%s\n");
  }
  fwrite("*/\n\n\n",5,1,(FILE *)f.file);
  return;
}

Assistant:

void printhead(struct fout f, struct rnndb *db) {
	int i, j;
	struct stat sb;
	struct tm tm;
	stat(f.name, &sb);
	gmtime_r(&sb.st_mtime, &tm);
	fprintf (f.file, "#ifndef %s\n", f.guard);
	fprintf (f.file, "#define %s\n", f.guard);
	fprintf (f.file, "\n");
	fprintf(f.file,
		"/* Autogenerated file, DO NOT EDIT manually!\n"
		"\n"
		"This file was generated by the rules-ng-ng headergen tool in this git repository:\n"
		"http://0x04.net/cgit/index.cgi/rules-ng-ng\n"
		"git clone git://0x04.net/rules-ng-ng\n"
		"\n"
		"The rules-ng-ng source files this header was generated from are:\n");
	unsigned maxlen = 0;
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		if(len > maxlen)
			maxlen = len;
	}
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		fprintf(f.file, "- %s%*s ", db->files[i], maxlen - len, "");
		print_file_info(f.file, db->files[i]);
	}
	fprintf(f.file,
		"\n"
		"Copyright (C) ");
	if(db->copyright.firstyear && db->copyright.firstyear < (1900 + tm.tm_year))
		fprintf(f.file, "%u-", db->copyright.firstyear);
	fprintf(f.file, "%u", 1900 + tm.tm_year);
	if(db->copyright.authorsnum) {
		fprintf(f.file, " by the following authors:");
		for(i = 0; i < db->copyright.authorsnum; ++i) {
			fprintf(f.file, "\n- ");
			if(db->copyright.authors[i]->name)
				fprintf(f.file, "%s", db->copyright.authors[i]->name);
			if(db->copyright.authors[i]->email)
				fprintf(f.file, " <%s>", db->copyright.authors[i]->email);
			if(db->copyright.authors[i]->nicknamesnum) {
				for(j = 0; j < db->copyright.authors[i]->nicknamesnum; ++j) {
					fprintf(f.file, "%s%s", (j ? ", " : " ("), db->copyright.authors[i]->nicknames[j]);
				}
				fprintf(f.file, ")");
			}
		}
	}
	fprintf(f.file, "\n");
	if(db->copyright.license)
		fprintf(f.file, "\n%s\n", db->copyright.license);
	fprintf(f.file, "*/\n\n\n");
}